

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void display_equip_cmp_help(void)

{
  int local_14;
  int local_10;
  wchar_t hgt;
  wchar_t wid;
  wchar_t irow;
  
  Term_clear();
  hgt = L'\x01';
  prt("Movement/scrolling ---------------------------------",L'\x01',L'\0');
  hgt = hgt + L'\x01';
  prt("j, down  one line down    k, up    one line up",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("n, PgDn  one page down    p, PgUp  one page up",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("space    one page down",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("Filtering/searching/sorting ------------------------",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("q        quick filter     !        use opposite quick",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("c        cycle through sources of items",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("r        reverse",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("Information ----------------------------------------",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("v        cycle through attribute views",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("I, x     select one or two items for details",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("Other ----------------------------------------------",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("d        dump to file     R        reset display",hgt,L'\0');
  hgt = hgt + L'\x01';
  prt("ESC      exit",hgt,L'\0');
  hgt = hgt + L'\x01';
  Term_get_size(&local_10,&local_14);
  prt("Press any key to continue",local_14 + L'\xffffffff',L'\0');
  inkey();
  return;
}

Assistant:

static void display_equip_cmp_help(void)
{
	int irow, wid, hgt;

	Term_clear();
	irow = 1;
	prt("Movement/scrolling ---------------------------------", irow, 0);
	++irow;
	prt("j, down  one line down    k, up    one line up", irow, 0);
	++irow;
	prt("n, PgDn  one page down    p, PgUp  one page up", irow, 0);
	++irow;
	prt("space    one page down", irow, 0);
	++irow;
	prt("Filtering/searching/sorting ------------------------", irow, 0);
	++irow;
	prt("q        quick filter     !        use opposite quick", irow, 0);
	++irow;
	prt("c        cycle through sources of items", irow, 0);
	++irow;
	prt("r        reverse", irow, 0);
	++irow;
	prt("Information ----------------------------------------", irow, 0);
	++irow;
	prt("v        cycle through attribute views", irow, 0);
	++irow;
	prt("I, x     select one or two items for details", irow, 0);
	++irow;
	prt("Other ----------------------------------------------", irow, 0);
	++irow;
	prt("d        dump to file     R        reset display", irow, 0);
	++irow;
	prt("ESC      exit", irow, 0);
	++irow;

	Term_get_size(&wid, &hgt);
	prt("Press any key to continue", hgt - 1, 0);
	(void) inkey();
}